

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O2

void sc_reduce(limb_t *dst,limb_t *e)

{
  long lVar1;
  ulong uVar2;
  lsc_t tmp;
  
  uVar2 = 0;
  for (lVar1 = 0; tmp[5] = (long)uVar2 >> 0x34, lVar1 != 5; lVar1 = lVar1 + 1) {
    uVar2 = tmp[5] + e[lVar1];
    tmp[lVar1] = uVar2 & 0xfffffffffffff;
  }
  for (lVar1 = 6; lVar1 != 10; lVar1 = lVar1 + 1) {
    tmp[lVar1] = 0;
  }
  sc_barrett(dst,tmp);
  return;
}

Assistant:

void
sc_reduce(sc_t dst, const sc_t e)
{
	lsc_t tmp;
	limb_t carry;
	int i;

	/* carry e */
	for (carry = 0, i = 0; i < K; i++) {
		carry = (carry >> LB) + e[i];
		tmp[i] = carry & MSK;
	}
	tmp[K] = carry >> LB;
	for (i = K+1; i < 2*K; i++)
		tmp[i] = 0;
	
	/* reduce modulo m */
	sc_barrett(dst, tmp);
}